

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O2

result_type_conflict1 __thiscall
trng::truncated_normal_dist<float>::cdf(truncated_normal_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  float fVar2;
  
  fVar2 = math::Phi((x - (this->P).mu_) / (this->P).sigma_);
  fVar1 = (this->P).Phi_a;
  return (fVar2 - fVar1) / ((this->P).Phi_b - fVar1);
}

Assistant:

cdf(result_type x) const {
      x -= P.mu();
      x /= P.sigma();
      return (math::Phi(x) - P.Phi_a) / (P.Phi_b - P.Phi_a);
    }